

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deClock.c
# Opt level: O3

deUint64 deGetMicroseconds(void)

{
  timespec currTime;
  timespec local_18;
  
  clock_gettime(1,&local_18);
  return local_18.tv_sec * 1000000 + (ulong)local_18.tv_nsec / 1000;
}

Assistant:

deUint64 deGetMicroseconds (void)
{
#if (DE_OS == DE_OS_WIN32)
	LARGE_INTEGER freq;
	LARGE_INTEGER count;
	QueryPerformanceCounter(&count);
	QueryPerformanceFrequency(&freq);
	DE_ASSERT(freq.LowPart != 0 || freq.HighPart != 0);
	/* \todo [2010-03-26 kalle] consider adding a 32bit-friendly implementation */

	if (count.QuadPart < MAXLONGLONG / 1000000)
	{
		DE_ASSERT(freq.QuadPart != 0);
		return count.QuadPart * 1000000 / freq.QuadPart;
	}
	else
	{
		DE_ASSERT(freq.QuadPart >= 1000000);
		return count.QuadPart / (freq.QuadPart / 1000000);
	}

#elif (DE_OS == DE_OS_UNIX) || (DE_OS == DE_OS_ANDROID) || (DE_OS == DE_OS_QNX)
	struct timespec currTime;
	clock_gettime(CLOCK_MONOTONIC, &currTime);
	return (deUint64)currTime.tv_sec*1000000 + ((deUint64)currTime.tv_nsec/1000);

#elif  (DE_OS == DE_OS_SYMBIAN)
	struct timespec currTime;
	/* Symbian supports only realtime clock for clock_gettime. */
	/* \todo [2011-08-22 kalle] Proper Symbian-based implementation that is guaranteed to be monotonic. */
	clock_gettime(CLOCK_REALTIME, &currTime);
	return (deUint64)currTime.tv_sec*1000000 + ((deUint64)currTime.tv_nsec/1000);

#elif (DE_OS == DE_OS_OSX) || (DE_OS == DE_OS_IOS)
	struct timeval currTime;
	gettimeofday(&currTime, DE_NULL);
	return (deUint64)currTime.tv_sec*1000000 + (deUint64)currTime.tv_usec;

#else
#   error "Not implemented for target OS"
#endif
}